

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O0

bool isBasisConsistent(HighsLp *lp,HighsBasis *basis)

{
  bool bVar1;
  const_reference pvVar2;
  long in_RSI;
  int *in_RDI;
  HighsInt iRow;
  HighsInt iCol;
  HighsInt num_basic_variables;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar4;
  bool local_1;
  
  bVar1 = isBasisRightSize((HighsLp *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                           (HighsBasis *)
                           CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (bVar1) {
    iVar4 = 0;
    for (iVar3 = 0; iVar3 < *in_RDI; iVar3 = iVar3 + 1) {
      pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (in_RSI + 0x30),(long)iVar3);
      if (*pvVar2 == kBasic) {
        iVar4 = iVar4 + 1;
      }
    }
    for (iVar3 = 0; iVar3 < in_RDI[1]; iVar3 = iVar3 + 1) {
      pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (in_RSI + 0x48),(long)iVar3);
      if (*pvVar2 == kBasic) {
        iVar4 = iVar4 + 1;
      }
    }
    local_1 = iVar4 == in_RDI[1];
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool isBasisConsistent(const HighsLp& lp, const HighsBasis& basis) {
  if (!isBasisRightSize(lp, basis)) return false;

  HighsInt num_basic_variables = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    if (basis.col_status[iCol] == HighsBasisStatus::kBasic)
      num_basic_variables++;
  }
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (basis.row_status[iRow] == HighsBasisStatus::kBasic)
      num_basic_variables++;
  }
  return num_basic_variables == lp.num_row_;
}